

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

void __thiscall iqxmlrpc::http::Header::Header(Header *this,Verification_level lev)

{
  Option_validator_fn local_150;
  allocator<char> local_129;
  string local_128;
  Option_validator_fn local_108;
  allocator<char> local_e1;
  string local_e0;
  Option_validator_fn local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Verification_level local_14;
  Header *pHStack_10;
  Verification_level lev_local;
  Header *this_local;
  
  this->_vptr_Header = (_func_int **)&PTR__Header_00252880;
  local_14 = lev;
  pHStack_10 = this;
  std::__cxx11::string::string((string *)&this->head_line_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->options_);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>_>_>
  ::multimap(&this->validators_);
  this->ver_level_ = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"connection",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"close",&local_71);
  set_option_default(this,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"content-length",&local_99)
  ;
  boost::function<void(std::__cxx11::string_const&)>::function<void(*)(std::__cxx11::string_const&)>
            ((function<void(std::__cxx11::string_const&)> *)&local_c0,validator::unsigned_number,0);
  register_validator(this,&local_98,&local_c0,HTTP_CHECK_WEAK);
  boost::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_c0);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"expect",&local_e1);
  boost::function<void(std::__cxx11::string_const&)>::function<void(*)(std::__cxx11::string_const&)>
            ((function<void(std::__cxx11::string_const&)> *)&local_108,validator::expect_continue,0)
  ;
  register_validator(this,&local_e0,&local_108,HTTP_CHECK_WEAK);
  boost::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_108);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"content-type",&local_129)
  ;
  boost::function<void(std::__cxx11::string_const&)>::function<void(*)(std::__cxx11::string_const&)>
            ((function<void(std::__cxx11::string_const&)> *)&local_150,validator::content_type,0);
  register_validator(this,&local_128,&local_150,HTTP_CHECK_STRICT);
  boost::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_150);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  return;
}

Assistant:

Header::Header(Verification_level lev):
  ver_level_(lev)
{
  set_option_default(names::connection, "close");
  register_validator(names::content_length, validator::unsigned_number, HTTP_CHECK_WEAK);
  register_validator(names::expect_continue, validator::expect_continue, HTTP_CHECK_WEAK);
  register_validator(names::content_type, validator::content_type, HTTP_CHECK_STRICT);
}